

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersectorKHybrid<4,_8,_16777232,_false,_embree::avx512::ArrayIntersectorK_1<8,_embree::avx512::InstanceArrayIntersectorKMB<8>_>,_false>
     ::intersect(vint<8> *valid_i,Intersectors *This,RayHitK<8> *ray,RayQueryContext *context)

{
  undefined1 (*pauVar1) [32];
  undefined4 uVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  undefined8 uVar10;
  ulong uVar11;
  ulong uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  ulong uVar23;
  long lVar24;
  AABBNodeMB4D *node1;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong *puVar28;
  undefined1 (*pauVar29) [32];
  uint uVar30;
  Primitive_conflict4 *prim;
  bool bVar31;
  ulong uVar32;
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [64];
  undefined1 in_ZMM1 [64];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  vbool<8>_conflict valid_leaf;
  Precalculations pre;
  NodeRef stack_node [241];
  vfloat<8> stack_near [241];
  vbool<8>_conflict local_2732;
  Precalculations local_2731;
  RayQueryContext *local_2730;
  long local_2728;
  undefined1 local_2720 [32];
  undefined1 local_2700 [32];
  undefined1 local_26e0 [32];
  undefined1 local_26c0 [32];
  undefined1 local_26a0 [32];
  undefined1 local_2680 [32];
  undefined1 local_2660 [32];
  undefined1 local_2640 [32];
  undefined8 uStack_2610;
  ulong local_2608 [241];
  undefined1 local_1e80 [32];
  undefined1 local_1e60 [32];
  undefined1 local_1e40 [7696];
  
  uVar26 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (uVar26 != 8) {
    auVar36 = vpcmpeqd_avx2(in_ZMM1._0_32_,in_ZMM1._0_32_);
    uVar23 = vpcmpeqd_avx512vl((undefined1  [32])valid_i->field_0,auVar36);
    if ((byte)uVar23 != 0) {
      auVar36 = *(undefined1 (*) [32])(ray + 0x80);
      auVar34 = *(undefined1 (*) [32])(ray + 0xa0);
      auVar35 = *(undefined1 (*) [32])(ray + 0xc0);
      local_1e80._8_4_ = 0x7f800000;
      local_1e80._0_8_ = 0x7f8000007f800000;
      local_1e80._12_4_ = 0x7f800000;
      local_1e80._16_4_ = 0x7f800000;
      local_1e80._20_4_ = 0x7f800000;
      local_1e80._24_4_ = 0x7f800000;
      local_1e80._28_4_ = 0x7f800000;
      auVar55 = ZEXT3264(local_1e80);
      auVar33 = *(undefined1 (*) [32])ray;
      auVar37._0_8_ = auVar33._0_8_ ^ 0x8000000080000000;
      auVar37._8_4_ = auVar33._8_4_ ^ 0x80000000;
      auVar37._12_4_ = auVar33._12_4_ ^ 0x80000000;
      auVar37._16_4_ = auVar33._16_4_ ^ 0x80000000;
      auVar37._20_4_ = auVar33._20_4_ ^ 0x80000000;
      auVar37._24_4_ = auVar33._24_4_ ^ 0x80000000;
      auVar37._28_4_ = auVar33._28_4_ ^ 0x80000000;
      auVar33 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x60),
                                SUB6432(ZEXT1664((undefined1  [16])0x0),0));
      bVar31 = (bool)((byte)uVar23 & 1);
      local_26c0._0_4_ = (uint)bVar31 * auVar33._0_4_ | (uint)!bVar31 * 0x7f800000;
      bVar31 = (bool)((byte)(uVar23 >> 1) & 1);
      local_26c0._4_4_ = (uint)bVar31 * auVar33._4_4_ | (uint)!bVar31 * 0x7f800000;
      bVar31 = (bool)((byte)(uVar23 >> 2) & 1);
      local_26c0._8_4_ = (uint)bVar31 * auVar33._8_4_ | (uint)!bVar31 * 0x7f800000;
      bVar31 = (bool)((byte)(uVar23 >> 3) & 1);
      local_26c0._12_4_ = (uint)bVar31 * auVar33._12_4_ | (uint)!bVar31 * 0x7f800000;
      bVar31 = (bool)((byte)(uVar23 >> 4) & 1);
      local_26c0._16_4_ = (uint)bVar31 * auVar33._16_4_ | (uint)!bVar31 * 0x7f800000;
      bVar31 = (bool)((byte)(uVar23 >> 5) & 1);
      local_26c0._20_4_ = (uint)bVar31 * auVar33._20_4_ | (uint)!bVar31 * 0x7f800000;
      bVar31 = (bool)((byte)(uVar23 >> 6) & 1);
      local_26c0._24_4_ = (uint)bVar31 * auVar33._24_4_ | (uint)!bVar31 * 0x7f800000;
      bVar31 = SUB81(uVar23 >> 7,0);
      local_26c0._28_4_ = (uint)bVar31 * auVar33._28_4_ | (uint)!bVar31 * 0x7f800000;
      auVar56 = ZEXT3264(local_26c0);
      auVar33 = *(undefined1 (*) [32])(ray + 0x20);
      auVar38._0_8_ = auVar33._0_8_ ^ 0x8000000080000000;
      auVar38._8_4_ = auVar33._8_4_ ^ 0x80000000;
      auVar38._12_4_ = auVar33._12_4_ ^ 0x80000000;
      auVar38._16_4_ = auVar33._16_4_ ^ 0x80000000;
      auVar38._20_4_ = auVar33._20_4_ ^ 0x80000000;
      auVar38._24_4_ = auVar33._24_4_ ^ 0x80000000;
      auVar38._28_4_ = auVar33._28_4_ ^ 0x80000000;
      auVar33 = *(undefined1 (*) [32])(ray + 0x40);
      auVar39._0_8_ = auVar33._0_8_ ^ 0x8000000080000000;
      auVar39._8_4_ = auVar33._8_4_ ^ 0x80000000;
      auVar39._12_4_ = auVar33._12_4_ ^ 0x80000000;
      auVar39._16_4_ = auVar33._16_4_ ^ 0x80000000;
      auVar39._20_4_ = auVar33._20_4_ ^ 0x80000000;
      auVar39._24_4_ = auVar33._24_4_ ^ 0x80000000;
      auVar39._28_4_ = auVar33._28_4_ ^ 0x80000000;
      uStack_2610 = 0xfffffffffffffff8;
      local_2608[0] = uVar26;
      local_1e60 = local_26c0;
      if (uVar26 != 0xfffffffffffffff8) {
        auVar41._8_4_ = 0x7fffffff;
        auVar41._0_8_ = 0x7fffffff7fffffff;
        auVar41._12_4_ = 0x7fffffff;
        auVar41._16_4_ = 0x7fffffff;
        auVar41._20_4_ = 0x7fffffff;
        auVar41._24_4_ = 0x7fffffff;
        auVar41._28_4_ = 0x7fffffff;
        auVar33 = vandps_avx(auVar36,auVar41);
        auVar43._8_4_ = 0x219392ef;
        auVar43._0_8_ = 0x219392ef219392ef;
        auVar43._12_4_ = 0x219392ef;
        auVar43._16_4_ = 0x219392ef;
        auVar43._20_4_ = 0x219392ef;
        auVar43._24_4_ = 0x219392ef;
        auVar43._28_4_ = 0x219392ef;
        uVar23 = vcmpps_avx512vl(auVar33,auVar43,1);
        bVar31 = (bool)((byte)uVar23 & 1);
        auVar33._0_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar36._0_4_;
        bVar31 = (bool)((byte)(uVar23 >> 1) & 1);
        auVar33._4_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar36._4_4_;
        bVar31 = (bool)((byte)(uVar23 >> 2) & 1);
        auVar33._8_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar36._8_4_;
        bVar31 = (bool)((byte)(uVar23 >> 3) & 1);
        auVar33._12_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar36._12_4_;
        bVar31 = (bool)((byte)(uVar23 >> 4) & 1);
        auVar33._16_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar36._16_4_;
        bVar31 = (bool)((byte)(uVar23 >> 5) & 1);
        auVar33._20_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar36._20_4_;
        bVar31 = (bool)((byte)(uVar23 >> 6) & 1);
        auVar33._24_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar36._24_4_;
        bVar31 = SUB81(uVar23 >> 7,0);
        auVar33._28_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar36._28_4_;
        auVar36 = vandps_avx(auVar34,auVar41);
        uVar23 = vcmpps_avx512vl(auVar36,auVar43,1);
        bVar31 = (bool)((byte)uVar23 & 1);
        auVar40._0_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar34._0_4_;
        bVar31 = (bool)((byte)(uVar23 >> 1) & 1);
        auVar40._4_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar34._4_4_;
        bVar31 = (bool)((byte)(uVar23 >> 2) & 1);
        auVar40._8_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar34._8_4_;
        bVar31 = (bool)((byte)(uVar23 >> 3) & 1);
        auVar40._12_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar34._12_4_;
        bVar31 = (bool)((byte)(uVar23 >> 4) & 1);
        auVar40._16_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar34._16_4_;
        bVar31 = (bool)((byte)(uVar23 >> 5) & 1);
        auVar40._20_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar34._20_4_;
        bVar31 = (bool)((byte)(uVar23 >> 6) & 1);
        auVar40._24_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar34._24_4_;
        bVar31 = SUB81(uVar23 >> 7,0);
        auVar40._28_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar34._28_4_;
        auVar36 = vandps_avx(auVar35,auVar41);
        uVar23 = vcmpps_avx512vl(auVar36,auVar43,1);
        bVar31 = (bool)((byte)uVar23 & 1);
        auVar36._0_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar35._0_4_;
        bVar31 = (bool)((byte)(uVar23 >> 1) & 1);
        auVar36._4_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar35._4_4_;
        bVar31 = (bool)((byte)(uVar23 >> 2) & 1);
        auVar36._8_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar35._8_4_;
        bVar31 = (bool)((byte)(uVar23 >> 3) & 1);
        auVar36._12_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar35._12_4_;
        bVar31 = (bool)((byte)(uVar23 >> 4) & 1);
        auVar36._16_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar35._16_4_;
        bVar31 = (bool)((byte)(uVar23 >> 5) & 1);
        auVar36._20_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar35._20_4_;
        bVar31 = (bool)((byte)(uVar23 >> 6) & 1);
        auVar36._24_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar35._24_4_;
        bVar31 = SUB81(uVar23 >> 7,0);
        auVar36._28_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar35._28_4_;
        auVar34 = vrcp14ps_avx512vl(auVar33);
        auVar42._8_4_ = 0x3f800000;
        auVar42._0_8_ = 0x3f8000003f800000;
        auVar42._12_4_ = 0x3f800000;
        auVar42._16_4_ = 0x3f800000;
        auVar42._20_4_ = 0x3f800000;
        auVar42._24_4_ = 0x3f800000;
        auVar42._28_4_ = 0x3f800000;
        auVar13 = vfnmadd213ps_fma(auVar33,auVar34,auVar42);
        auVar35 = vrcp14ps_avx512vl(auVar40);
        auVar14 = vfnmadd213ps_fma(auVar40,auVar35,auVar42);
        auVar33 = vrcp14ps_avx512vl(auVar36);
        auVar15 = vfnmadd213ps_fma(auVar36,auVar33,auVar42);
        auVar13 = vfmadd132ps_fma(ZEXT1632(auVar13),auVar34,auVar34);
        auVar52 = ZEXT1664(auVar13);
        auVar14 = vfmadd132ps_fma(ZEXT1632(auVar14),auVar35,auVar35);
        auVar53 = ZEXT1664(auVar14);
        auVar15 = vfmadd132ps_fma(ZEXT1632(auVar15),auVar33,auVar33);
        auVar54 = ZEXT1664(auVar15);
        local_2660 = ZEXT1632(auVar13);
        local_26e0 = vmulps_avx512vl(local_2660,auVar37);
        auVar57 = ZEXT3264(local_26e0);
        local_2680 = ZEXT1632(auVar14);
        local_2700 = vmulps_avx512vl(local_2680,auVar38);
        auVar58 = ZEXT3264(local_2700);
        local_26a0 = ZEXT1632(auVar15);
        local_2720 = vmulps_avx512vl(local_26a0,auVar39);
        auVar59 = ZEXT3264(local_2720);
        auVar36 = vpcmpeqd_avx2(auVar37,auVar37);
        uVar23 = vpcmpeqd_avx512vl((undefined1  [32])valid_i->field_0,auVar36);
        puVar28 = local_2608;
        auVar36 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar34 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),
                                  SUB6432(ZEXT1664((undefined1  [16])0x0),0));
        bVar31 = (bool)((byte)uVar23 & 1);
        bVar3 = (bool)((byte)(uVar23 >> 1) & 1);
        bVar4 = (bool)((byte)(uVar23 >> 2) & 1);
        bVar5 = (bool)((byte)(uVar23 >> 3) & 1);
        bVar6 = (bool)((byte)(uVar23 >> 4) & 1);
        bVar7 = (bool)((byte)(uVar23 >> 5) & 1);
        bVar8 = (bool)((byte)(uVar23 >> 6) & 1);
        bVar9 = SUB81(uVar23 >> 7,0);
        auVar60 = ZEXT3264(CONCAT428((uint)bVar9 * auVar34._28_4_ | (uint)!bVar9 * auVar36._28_4_,
                                     CONCAT424((uint)bVar8 * auVar34._24_4_ |
                                               (uint)!bVar8 * auVar36._24_4_,
                                               CONCAT420((uint)bVar7 * auVar34._20_4_ |
                                                         (uint)!bVar7 * auVar36._20_4_,
                                                         CONCAT416((uint)bVar6 * auVar34._16_4_ |
                                                                   (uint)!bVar6 * auVar36._16_4_,
                                                                   CONCAT412((uint)bVar5 *
                                                                             auVar34._12_4_ |
                                                                             (uint)!bVar5 *
                                                                             auVar36._12_4_,
                                                                             CONCAT48((uint)bVar4 *
                                                                                      auVar34._8_4_
                                                                                      | (uint)!bVar4
                                                                                        * auVar36.
                                                  _8_4_,CONCAT44((uint)bVar3 * auVar34._4_4_ |
                                                                 (uint)!bVar3 * auVar36._4_4_,
                                                                 (uint)bVar31 * auVar34._0_4_ |
                                                                 (uint)!bVar31 * auVar36._0_4_))))))
                                    ));
        pauVar29 = (undefined1 (*) [32])local_1e40;
        local_2730 = context;
        do {
          pauVar1 = pauVar29 + -1;
          auVar45 = ZEXT3264(*pauVar1);
          pauVar29 = pauVar29 + -1;
          local_2640 = auVar60._0_32_;
          uVar10 = vcmpps_avx512vl(*pauVar1,local_2640,1);
          if ((char)uVar10 != '\0') {
            while( true ) {
              uVar30 = (uint)uVar26;
              auVar36 = auVar45._0_32_;
              if ((uVar26 & 8) != 0) break;
              uVar25 = uVar26 & 0xfffffffffffffff0;
              uVar23 = 0;
              auVar45 = ZEXT3264(auVar55._0_32_);
              lVar24 = -0x10;
              uVar26 = 8;
              do {
                uVar27 = *(ulong *)(uVar25 + 0x20 + lVar24 * 2);
                if (uVar27 == 8) break;
                uVar2 = *(undefined4 *)(uVar25 + 0x90 + lVar24);
                auVar46._4_4_ = uVar2;
                auVar46._0_4_ = uVar2;
                auVar46._8_4_ = uVar2;
                auVar46._12_4_ = uVar2;
                auVar46._16_4_ = uVar2;
                auVar46._20_4_ = uVar2;
                auVar46._24_4_ = uVar2;
                auVar46._28_4_ = uVar2;
                auVar34 = *(undefined1 (*) [32])(ray + 0xe0);
                uVar2 = *(undefined4 *)(uVar25 + 0x30 + lVar24);
                auVar35._4_4_ = uVar2;
                auVar35._0_4_ = uVar2;
                auVar35._8_4_ = uVar2;
                auVar35._12_4_ = uVar2;
                auVar35._16_4_ = uVar2;
                auVar35._20_4_ = uVar2;
                auVar35._24_4_ = uVar2;
                auVar35._28_4_ = uVar2;
                auVar35 = vfmadd213ps_avx512vl(auVar46,auVar34,auVar35);
                uVar2 = *(undefined4 *)(uVar25 + 0xb0 + lVar24);
                auVar47._4_4_ = uVar2;
                auVar47._0_4_ = uVar2;
                auVar47._8_4_ = uVar2;
                auVar47._12_4_ = uVar2;
                auVar47._16_4_ = uVar2;
                auVar47._20_4_ = uVar2;
                auVar47._24_4_ = uVar2;
                auVar47._28_4_ = uVar2;
                uVar2 = *(undefined4 *)(uVar25 + 0x50 + lVar24);
                auVar16._4_4_ = uVar2;
                auVar16._0_4_ = uVar2;
                auVar16._8_4_ = uVar2;
                auVar16._12_4_ = uVar2;
                auVar16._16_4_ = uVar2;
                auVar16._20_4_ = uVar2;
                auVar16._24_4_ = uVar2;
                auVar16._28_4_ = uVar2;
                auVar33 = vfmadd213ps_avx512vl(auVar47,auVar34,auVar16);
                uVar2 = *(undefined4 *)(uVar25 + 0xd0 + lVar24);
                auVar48._4_4_ = uVar2;
                auVar48._0_4_ = uVar2;
                auVar48._8_4_ = uVar2;
                auVar48._12_4_ = uVar2;
                auVar48._16_4_ = uVar2;
                auVar48._20_4_ = uVar2;
                auVar48._24_4_ = uVar2;
                auVar48._28_4_ = uVar2;
                uVar2 = *(undefined4 *)(uVar25 + 0x70 + lVar24);
                auVar17._4_4_ = uVar2;
                auVar17._0_4_ = uVar2;
                auVar17._8_4_ = uVar2;
                auVar17._12_4_ = uVar2;
                auVar17._16_4_ = uVar2;
                auVar17._20_4_ = uVar2;
                auVar17._24_4_ = uVar2;
                auVar17._28_4_ = uVar2;
                auVar37 = vfmadd213ps_avx512vl(auVar48,auVar34,auVar17);
                uVar2 = *(undefined4 *)(uVar25 + 0xa0 + lVar24);
                auVar49._4_4_ = uVar2;
                auVar49._0_4_ = uVar2;
                auVar49._8_4_ = uVar2;
                auVar49._12_4_ = uVar2;
                auVar49._16_4_ = uVar2;
                auVar49._20_4_ = uVar2;
                auVar49._24_4_ = uVar2;
                auVar49._28_4_ = uVar2;
                uVar2 = *(undefined4 *)(uVar25 + 0x40 + lVar24);
                auVar18._4_4_ = uVar2;
                auVar18._0_4_ = uVar2;
                auVar18._8_4_ = uVar2;
                auVar18._12_4_ = uVar2;
                auVar18._16_4_ = uVar2;
                auVar18._20_4_ = uVar2;
                auVar18._24_4_ = uVar2;
                auVar18._28_4_ = uVar2;
                auVar38 = vfmadd213ps_avx512vl(auVar49,auVar34,auVar18);
                uVar2 = *(undefined4 *)(uVar25 + 0xc0 + lVar24);
                auVar50._4_4_ = uVar2;
                auVar50._0_4_ = uVar2;
                auVar50._8_4_ = uVar2;
                auVar50._12_4_ = uVar2;
                auVar50._16_4_ = uVar2;
                auVar50._20_4_ = uVar2;
                auVar50._24_4_ = uVar2;
                auVar50._28_4_ = uVar2;
                uVar2 = *(undefined4 *)(uVar25 + 0x60 + lVar24);
                auVar19._4_4_ = uVar2;
                auVar19._0_4_ = uVar2;
                auVar19._8_4_ = uVar2;
                auVar19._12_4_ = uVar2;
                auVar19._16_4_ = uVar2;
                auVar19._20_4_ = uVar2;
                auVar19._24_4_ = uVar2;
                auVar19._28_4_ = uVar2;
                auVar39 = vfmadd213ps_avx512vl(auVar50,auVar34,auVar19);
                uVar2 = *(undefined4 *)(uVar25 + 0xe0 + lVar24);
                auVar51._4_4_ = uVar2;
                auVar51._0_4_ = uVar2;
                auVar51._8_4_ = uVar2;
                auVar51._12_4_ = uVar2;
                auVar51._16_4_ = uVar2;
                auVar51._20_4_ = uVar2;
                auVar51._24_4_ = uVar2;
                auVar51._28_4_ = uVar2;
                uVar2 = *(undefined4 *)(uVar25 + 0x80 + lVar24);
                auVar20._4_4_ = uVar2;
                auVar20._0_4_ = uVar2;
                auVar20._8_4_ = uVar2;
                auVar20._12_4_ = uVar2;
                auVar20._16_4_ = uVar2;
                auVar20._20_4_ = uVar2;
                auVar20._24_4_ = uVar2;
                auVar20._28_4_ = uVar2;
                auVar40 = vfmadd213ps_avx512vl(auVar51,auVar34,auVar20);
                auVar41 = vfmadd213ps_avx512vl(auVar35,auVar52._0_32_,auVar57._0_32_);
                auVar42 = vfmadd213ps_avx512vl(auVar33,auVar53._0_32_,auVar58._0_32_);
                auVar43 = vfmadd213ps_avx512vl(auVar37,auVar54._0_32_,auVar59._0_32_);
                auVar37 = vfmadd213ps_avx512vl(auVar38,auVar52._0_32_,auVar57._0_32_);
                auVar38 = vfmadd213ps_avx512vl(auVar39,auVar53._0_32_,auVar58._0_32_);
                auVar39 = vfmadd213ps_avx512vl(auVar40,auVar54._0_32_,auVar59._0_32_);
                auVar35 = vpminsd_avx2(auVar41,auVar37);
                auVar33 = vpminsd_avx2(auVar42,auVar38);
                auVar35 = vpmaxsd_avx2(auVar35,auVar33);
                auVar33 = vpminsd_avx2(auVar43,auVar39);
                auVar35 = vpmaxsd_avx2(auVar35,auVar33);
                auVar33 = vpmaxsd_avx2(auVar41,auVar37);
                auVar37 = vpmaxsd_avx2(auVar42,auVar38);
                auVar38 = vpminsd_avx2(auVar33,auVar37);
                auVar33 = vpmaxsd_avx2(auVar43,auVar39);
                auVar37 = vpmaxsd_avx2(auVar35,auVar56._0_32_);
                auVar33 = vpminsd_avx512vl(auVar33,local_2640);
                auVar33 = vpminsd_avx2(auVar38,auVar33);
                uVar32 = vcmpps_avx512vl(auVar37,auVar33,2);
                if ((uVar30 & 7) == 6) {
                  uVar2 = *(undefined4 *)(uVar25 + 0xf0 + lVar24);
                  auVar21._4_4_ = uVar2;
                  auVar21._0_4_ = uVar2;
                  auVar21._8_4_ = uVar2;
                  auVar21._12_4_ = uVar2;
                  auVar21._16_4_ = uVar2;
                  auVar21._20_4_ = uVar2;
                  auVar21._24_4_ = uVar2;
                  auVar21._28_4_ = uVar2;
                  uVar11 = vcmpps_avx512vl(auVar34,auVar21,0xd);
                  uVar2 = *(undefined4 *)(uVar25 + 0x100 + lVar24);
                  auVar22._4_4_ = uVar2;
                  auVar22._0_4_ = uVar2;
                  auVar22._8_4_ = uVar2;
                  auVar22._12_4_ = uVar2;
                  auVar22._16_4_ = uVar2;
                  auVar22._20_4_ = uVar2;
                  auVar22._24_4_ = uVar2;
                  auVar22._28_4_ = uVar2;
                  uVar12 = vcmpps_avx512vl(auVar34,auVar22,1);
                  uVar32 = uVar32 & uVar11 & uVar12;
                }
                uVar11 = vcmpps_avx512vl(local_2640,auVar36,6);
                uVar32 = uVar32 & uVar11;
                if ((byte)uVar32 != 0) {
                  auVar35 = vblendmps_avx512vl(auVar55._0_32_,auVar35);
                  bVar31 = (bool)((byte)uVar32 & 1);
                  auVar44._0_4_ = (uint)bVar31 * auVar35._0_4_ | (uint)!bVar31 * auVar34._0_4_;
                  bVar31 = (bool)((byte)(uVar32 >> 1) & 1);
                  auVar44._4_4_ = (uint)bVar31 * auVar35._4_4_ | (uint)!bVar31 * auVar34._4_4_;
                  bVar31 = (bool)((byte)(uVar32 >> 2) & 1);
                  auVar44._8_4_ = (uint)bVar31 * auVar35._8_4_ | (uint)!bVar31 * auVar34._8_4_;
                  bVar31 = (bool)((byte)(uVar32 >> 3) & 1);
                  auVar44._12_4_ = (uint)bVar31 * auVar35._12_4_ | (uint)!bVar31 * auVar34._12_4_;
                  bVar31 = (bool)((byte)(uVar32 >> 4) & 1);
                  auVar44._16_4_ = (uint)bVar31 * auVar35._16_4_ | (uint)!bVar31 * auVar34._16_4_;
                  bVar31 = (bool)((byte)(uVar32 >> 5) & 1);
                  auVar44._20_4_ = (uint)bVar31 * auVar35._20_4_ | (uint)!bVar31 * auVar34._20_4_;
                  bVar31 = (bool)((byte)(uVar32 >> 6) & 1);
                  auVar44._24_4_ = (uint)bVar31 * auVar35._24_4_ | (uint)!bVar31 * auVar34._24_4_;
                  bVar31 = SUB81(uVar32 >> 7,0);
                  auVar44._28_4_ = (uint)bVar31 * auVar35._28_4_ | (uint)!bVar31 * auVar34._28_4_;
                  auVar35 = auVar45._0_32_;
                  uVar10 = vcmpps_avx512vl(auVar44,auVar35,1);
                  uVar32 = uVar27;
                  auVar34 = auVar44;
                  if (((char)uVar10 == '\0') ||
                     (bVar31 = uVar26 != 8, uVar32 = uVar26, uVar26 = uVar27, auVar34 = auVar35,
                     auVar35 = auVar44, bVar31)) {
                    auVar44 = auVar35;
                    uVar23 = uVar23 + 1;
                    *puVar28 = uVar32;
                    puVar28 = puVar28 + 1;
                    *pauVar29 = auVar34;
                    pauVar29 = pauVar29 + 1;
                    uVar27 = uVar26;
                  }
                  auVar45 = ZEXT3264(auVar44);
                  uVar26 = uVar27;
                }
                lVar24 = lVar24 + 4;
              } while (lVar24 != 0);
              if (uVar26 == 8) goto LAB_007137c8;
              if (1 < uVar23) {
                auVar35 = pauVar29[-2];
                auVar36 = pauVar29[-1];
                uVar10 = vcmpps_avx512vl(auVar35,auVar36,1);
                auVar34 = auVar36;
                if ((char)uVar10 != '\0') {
                  pauVar29[-2] = auVar36;
                  pauVar29[-1] = auVar35;
                  auVar13 = vpermilps_avx(*(undefined1 (*) [16])(puVar28 + -2),0x4e);
                  *(undefined1 (*) [16])(puVar28 + -2) = auVar13;
                  auVar34 = auVar35;
                  auVar35 = auVar36;
                }
                if (uVar23 != 2) {
                  auVar36 = pauVar29[-3];
                  uVar10 = vcmpps_avx512vl(auVar36,auVar34,1);
                  if ((char)uVar10 != '\0') {
                    pauVar29[-3] = auVar34;
                    pauVar29[-1] = auVar36;
                    uVar23 = puVar28[-3];
                    puVar28[-3] = puVar28[-1];
                    puVar28[-1] = uVar23;
                    auVar36 = auVar34;
                  }
                  uVar10 = vcmpps_avx512vl(auVar36,auVar35,1);
                  if ((char)uVar10 != '\0') {
                    pauVar29[-3] = auVar35;
                    pauVar29[-2] = auVar36;
                    auVar13 = vpermilps_avx(*(undefined1 (*) [16])(puVar28 + -3),0x4e);
                    *(undefined1 (*) [16])(puVar28 + -3) = auVar13;
                  }
                }
              }
            }
            if (uVar26 == 0xfffffffffffffff8) {
              return;
            }
            uVar23 = vcmpps_avx512vl(local_2640,auVar36,6);
            local_2732.v = (__mmask8)uVar23;
            if (local_2732.v != 0) {
              local_2728 = (ulong)(uVar30 & 0xf) - 8;
              if (local_2728 != 0) {
                prim = (Primitive_conflict4 *)(uVar26 & 0xfffffffffffffff0);
                do {
                  InstanceArrayIntersectorKMB<8>::intersect
                            (&local_2732,&local_2731,ray,context,prim);
                  prim = prim + 1;
                  local_2728 = local_2728 + -1;
                  context = local_2730;
                } while (local_2728 != 0);
                uVar23 = (ulong)local_2732.v;
                auVar52 = ZEXT3264(local_2660);
                auVar53 = ZEXT3264(local_2680);
                auVar54 = ZEXT3264(local_26a0);
                auVar55 = ZEXT3264(CONCAT428(0x7f800000,
                                             CONCAT424(0x7f800000,
                                                       CONCAT420(0x7f800000,
                                                                 CONCAT416(0x7f800000,
                                                                           CONCAT412(0x7f800000,
                                                                                     CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
                auVar56 = ZEXT3264(local_26c0);
                auVar57 = ZEXT3264(local_26e0);
                auVar58 = ZEXT3264(local_2700);
                auVar59 = ZEXT3264(local_2720);
              }
              bVar31 = (bool)((byte)uVar23 & 1);
              bVar3 = (bool)((byte)(uVar23 >> 1) & 1);
              bVar4 = (bool)((byte)(uVar23 >> 2) & 1);
              bVar5 = (bool)((byte)(uVar23 >> 3) & 1);
              bVar6 = (bool)((byte)(uVar23 >> 4) & 1);
              bVar7 = (bool)((byte)(uVar23 >> 5) & 1);
              bVar8 = (bool)((byte)(uVar23 >> 6) & 1);
              bVar9 = SUB81(uVar23 >> 7,0);
              auVar60 = ZEXT3264(CONCAT428((uint)bVar9 * *(int *)(ray + 0x11c) |
                                           (uint)!bVar9 * local_2640._28_4_,
                                           CONCAT424((uint)bVar8 * *(int *)(ray + 0x118) |
                                                     (uint)!bVar8 * local_2640._24_4_,
                                                     CONCAT420((uint)bVar7 * *(int *)(ray + 0x114) |
                                                               (uint)!bVar7 * local_2640._20_4_,
                                                               CONCAT416((uint)bVar6 *
                                                                         *(int *)(ray + 0x110) |
                                                                         (uint)!bVar6 *
                                                                         local_2640._16_4_,
                                                                         CONCAT412((uint)bVar5 *
                                                                                   *(int *)(ray + 
                                                  0x10c) | (uint)!bVar5 * local_2640._12_4_,
                                                  CONCAT48((uint)bVar4 * *(int *)(ray + 0x108) |
                                                           (uint)!bVar4 * local_2640._8_4_,
                                                           CONCAT44((uint)bVar3 *
                                                                    *(int *)(ray + 0x104) |
                                                                    (uint)!bVar3 * local_2640._4_4_,
                                                                    (uint)bVar31 *
                                                                    *(int *)(ray + 0x100) |
                                                                    (uint)!bVar31 * local_2640._0_4_
                                                                   ))))))));
            }
          }
LAB_007137c8:
          uVar26 = puVar28[-1];
          puVar28 = puVar28 + -1;
        } while (uVar26 != 0xfffffffffffffff8);
      }
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect(vint<K>* __restrict__ valid_i,
                                                                                               Accel::Intersectors* __restrict__ This,
                                                                                               RayHitK<K>& __restrict__ ray,
                                                                                               RayQueryContext* __restrict__ context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
            
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        intersectCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out invalid rays */
      vbool<K> valid = *valid_i == -1;
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      size_t valid_bits = movemask(valid);

#if defined(__AVX__)
      STAT3(normal.trav_hit_boxes[popcnt(movemask(valid))], 1, 1, 1);
#endif

      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      if (single)
      {
        tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));
        
        for (; valid_bits!=0; ) {
          const size_t i = bscf(valid_bits);
          intersect1(This, bvh, bvh->root, i, pre, ray, tray, context);
        }
        return;
      }

       /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      vint<K> octant = ray.octant();
      octant = select(valid, octant, vint<K>(0xffffffff));

      /* test whether we have ray with opposing direction signs in the packet */
      bool split = false;
      {
        size_t bits = valid_bits;
        vbool<K> vsplit( false );
        do
        {
          const size_t valid_index = bsf(bits);
          vbool<K> octant_valid = octant[valid_index] == octant;
          bits &= ~(size_t)movemask(octant_valid);
          vsplit |= vint<K>(octant[valid_index]) == (octant^vint<K>(0x7));
        } while (bits);
        if (any(vsplit)) split = true;
      }

      do
      {
        const size_t valid_index = bsf(valid_bits);
        const vint<K> diff_octant = vint<K>(octant[valid_index])^octant;
        const vint<K> count_diff_octant = \
          ((diff_octant >> 2) & 1) +
          ((diff_octant >> 1) & 1) +
          ((diff_octant >> 0) & 1);

        vbool<K> octant_valid = (count_diff_octant <= 1) & (octant != vint<K>(0xffffffff));
        if (!single || !split) octant_valid = valid; // deactivate octant sorting in pure chunk mode, otherwise instance traversal performance goes down 


        octant = select(octant_valid,vint<K>(0xffffffff),octant);
        valid_bits &= ~(size_t)movemask(octant_valid);

        tray.tnear = select(octant_valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(octant_valid, org_ray_tfar , vfloat<K>(neg_inf));

        /* allocate stack and push root node */
        vfloat<K> stack_near[stackSizeChunk];
        NodeRef stack_node[stackSizeChunk];
        stack_node[0] = BVH::invalidNode;
        stack_near[0] = inf;
        stack_node[1] = bvh->root;
        stack_near[1] = tray.tnear;
        NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
        NodeRef* __restrict__ sptr_node = stack_node + 2;
        vfloat<K>* __restrict__ sptr_near = stack_near + 2;

        while (1) pop:
        {
          /* pop next node from stack */
          assert(sptr_node > stack_node);
          sptr_node--;
          sptr_near--;
          NodeRef cur = *sptr_node;
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* cull node if behind closest hit point */
          vfloat<K> curDist = *sptr_near;
          const vbool<K> active = curDist < tray.tfar;
          if (unlikely(none(active)))
            continue;

          /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
          if (single)
#endif
          {
            size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
            if (unlikely(popcnt(bits) <= switchThreshold))
#endif
            {
              for (; bits!=0; ) {
                const size_t i = bscf(bits);
                intersect1(This, bvh, cur, i, pre, ray, tray, context);
              }
              tray.tfar = min(tray.tfar, ray.tfar);
              continue;
            }
          }
#endif
          while (likely(!cur.isLeaf()))
          {
            /* process nodes */
            const vbool<K> valid_node = tray.tfar > curDist;
            STAT3(normal.trav_nodes, 1, popcnt(valid_node), K);
            const NodeRef nodeRef = cur;
            const BaseNode* __restrict__ const node = nodeRef.baseNode();

            /* set cur to invalid */
            cur = BVH::emptyNode;
            curDist = pos_inf;

            size_t num_child_hits = 0;

            for (unsigned i = 0; i < N; i++)
            {
              const NodeRef child = node->children[i];
              if (unlikely(child == BVH::emptyNode)) break;
              vfloat<K> lnearP;
              vbool<K> lhit = valid_node;
              BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

              /* if we hit the child we choose to continue with that child if it
                 is closer than the current next child, or we push it onto the stack */
              if (likely(any(lhit)))
              {                                
                assert(sptr_node < stackEnd);
                assert(child != BVH::emptyNode);
                const vfloat<K> childDist = select(lhit, lnearP, inf);
                /* push cur node onto stack and continue with hit child */
                if (any(childDist < curDist))
                {
                  if (likely(cur != BVH::emptyNode)) {
                    num_child_hits++;
                    *sptr_node = cur; sptr_node++;
                    *sptr_near = curDist; sptr_near++;
                  }
                  curDist = childDist;
                  cur = child;
                }

                /* push hit child onto stack */
                else {
                  num_child_hits++;                  
                  *sptr_node = child; sptr_node++;
                  *sptr_near = childDist; sptr_near++;
                }
              }
            }

#if defined(__AVX__)
            //STAT3(normal.trav_hit_boxes[num_child_hits], 1, 1, 1);
#endif

            if (unlikely(cur == BVH::emptyNode))
              goto pop;
            
            /* improved distance sorting for 3 or more hits */
            if (unlikely(num_child_hits >= 2))
            {
              if (any(sptr_near[-2] < sptr_near[-1]))
              {
                std::swap(sptr_near[-2],sptr_near[-1]);
                std::swap(sptr_node[-2],sptr_node[-1]);
              }
              if (unlikely(num_child_hits >= 3))
              {
                if (any(sptr_near[-3] < sptr_near[-1]))
                {
                  std::swap(sptr_near[-3],sptr_near[-1]);
                  std::swap(sptr_node[-3],sptr_node[-1]);
                }
                if (any(sptr_near[-3] < sptr_near[-2]))
                {
                  std::swap(sptr_near[-3],sptr_near[-2]);
                  std::swap(sptr_node[-3],sptr_node[-2]);
                }
              }
            }

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
            if (single)
            {
              // seems to be the best place for testing utilization
              if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
              {
                *sptr_node++ = cur;
                *sptr_near++ = curDist;
                goto pop;
              }
            }
#endif
          }

          /* return if stack is empty */
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* intersect leaf */
          assert(cur != BVH::emptyNode);
          const vbool<K> valid_leaf = tray.tfar > curDist;
          STAT3(normal.trav_leaves, 1, popcnt(valid_leaf), K);
          if (unlikely(none(valid_leaf))) continue;
          size_t items; const Primitive* prim = (Primitive*)cur.leaf(items);

          size_t lazy_node = 0;
          PrimitiveIntersectorK::intersect(valid_leaf, This, pre, ray, context, prim, items, tray, lazy_node);
          tray.tfar = select(valid_leaf, ray.tfar, tray.tfar);

          if (unlikely(lazy_node)) {
            *sptr_node = lazy_node; sptr_node++;
            *sptr_near = neg_inf;   sptr_near++;
          }
        }
      } while(valid_bits);
    }